

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O0

bool __thiscall pbrt::GeometricPrimitive::IntersectP(GeometricPrimitive *this,Ray *r,Float tMax)

{
  bool bVar1;
  long in_RDI;
  Float in_stack_000001dc;
  Ray *in_stack_000001e0;
  GeometricPrimitive *in_stack_000001e8;
  MaterialHandle *in_stack_fffffffffffffeb0;
  optional<pbrt::ShapeIntersection> *this_00;
  Ray *in_stack_fffffffffffffec8;
  ShapeHandle *in_stack_fffffffffffffed0;
  optional<pbrt::ShapeIntersection> local_128;
  byte local_1;
  
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RDI + 8));
  if ((bVar1) && (bVar1 = MaterialHandle::IsTransparent(in_stack_fffffffffffffeb0), bVar1)) {
    local_1 = 0;
  }
  else {
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RDI + 0x28));
    if (bVar1) {
      this_00 = &local_128;
      Intersect(in_stack_000001e8,in_stack_000001e0,in_stack_000001dc);
      local_1 = pstd::optional<pbrt::ShapeIntersection>::has_value(this_00);
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)0x846f8d);
    }
    else {
      local_1 = ShapeHandle::IntersectP
                          (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                           (Float)((ulong)in_RDI >> 0x20));
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool GeometricPrimitive::IntersectP(const Ray &r, Float tMax) const {
    // Skip shadow intersection test for transparent materials
    if (material && material.IsTransparent())
        return false;

    // Perform shadow intersection with test, handling alpha if necessary
    if (alpha)
        return Intersect(r, tMax).has_value();
    else
        return shape.IntersectP(r, tMax);
}